

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

Nonnull<const_char_*>
absl::lts_20250127::status_internal::MakeCheckFailString
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  pointer pcVar1;
  string *__return_storage_ptr__;
  StatusToStringMode in_ECX;
  AlphaNum *in_R9;
  string local_100;
  AlphaNum local_e0;
  size_t local_b0;
  Nonnull<const_char_*> local_a8;
  AlphaNum local_80;
  AlphaNum local_50;
  
  __return_storage_ptr__ = (string *)operator_new(0x20);
  if (prefix == (Nonnull<const_char_*>)0x0) {
    local_b0 = 0;
    prefix = (Nonnull<const_char_*>)0x0;
  }
  else {
    local_b0 = strlen(prefix);
  }
  local_e0.piece_._M_len = 2;
  local_e0.piece_._M_str = " (";
  local_a8 = prefix;
  if ((Status *)status->rep_ == (Status *)0x1) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100.field_2._M_allocated_capacity._0_2_ = 0x4b4f;
    local_100._M_string_length = 2;
    local_100.field_2._M_local_buf[2] = '\0';
  }
  else {
    Status::ToStringSlow_abi_cxx11_(&local_100,(Status *)status->rep_,0xffffffff,in_ECX);
  }
  local_50.piece_._M_len = local_100._M_string_length;
  local_50.piece_._M_str = local_100._M_dataplus._M_p;
  local_80.piece_._M_len = 1;
  local_80.piece_._M_str = ")";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_b0,&local_e0,&local_50,&local_80,
                    in_R9);
  DoIgnoreLeak(__return_storage_ptr__);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT53(local_100.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_100.field_2._M_local_buf[2],
                                      local_100.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(
             new std::string(absl::StrCat(
                 prefix, " (",
                 status->ToString(StatusToStringMode::kWithEverything), ")")))
      ->c_str();
}